

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

ExpressionValue * __thiscall
ExpressionValue::operator/
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  long lVar1;
  int64_t iVar2;
  char *text;
  double dVar3;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  switch(this->type << 2 | other->type) {
  case 5:
    __return_storage_ptr__->type = Integer;
    lVar1 = (other->field_1).intValue;
    if (lVar1 == -1 && (this->field_1).intValue == -0x8000000000000000) {
      iVar2 = -0x8000000000000000;
      text = "Division overflow in expression";
    }
    else {
      if (lVar1 != 0) {
        (__return_storage_ptr__->field_1).intValue = (this->field_1).intValue / lVar1;
        return __return_storage_ptr__;
      }
      text = "Integer division by zero in expression";
      iVar2 = -1;
    }
    (__return_storage_ptr__->field_1).intValue = iVar2;
    Logger::queueError<>(Warning,text);
    return __return_storage_ptr__;
  case 6:
    __return_storage_ptr__->type = Float;
    dVar3 = (double)(this->field_1).intValue;
    break;
  default:
    goto switchD_00179ee7_caseD_7;
  case 9:
    __return_storage_ptr__->type = Float;
    dVar3 = (this->field_1).floatValue / (double)(other->field_1).intValue;
    goto LAB_00179f52;
  case 10:
    __return_storage_ptr__->type = Float;
    dVar3 = (this->field_1).floatValue;
  }
  dVar3 = dVar3 / (other->field_1).floatValue;
LAB_00179f52:
  (__return_storage_ptr__->field_1).floatValue = dVar3;
switchD_00179ee7_caseD_7:
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator/(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		if (intValue == INT64_MIN && other.intValue == -1){
			result.intValue = INT64_MIN;
			Logger::queueError(Logger::Warning, "Division overflow in expression");
			return result;
		}
		if (other.intValue == 0)
		{
			result.intValue = ~0;
			Logger::queueError(Logger::Warning, "Integer division by zero in expression");
			return result;
		}
		result.intValue = intValue / other.intValue;
		break;
	case ExpressionValueCombination::FI:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue / other.intValue;
		break;
	case ExpressionValueCombination::IF:
		result.type = ExpressionValueType::Float;
		result.floatValue = intValue / other.floatValue;
		break;
	case ExpressionValueCombination::FF:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue / other.floatValue;
		break;
	default:
		break;
	}

	return result;
}